

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::UninterpretedOption::MergeFrom
          (UninterpretedOption *this,UninterpretedOption *from)

{
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  string *psVar4;
  string *psVar5;
  void **our_elems;
  int iVar6;
  Arena *pAVar7;
  
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  iVar6 = (from->name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 != 0) {
    pRVar3 = (from->name_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->name_).super_RepeatedPtrFieldBase,iVar6);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
              (&(this->name_).super_RepeatedPtrFieldBase,our_elems,pRVar3->elements,iVar6,
               ((this->name_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->name_).super_RepeatedPtrFieldBase.current_size_);
    iVar6 = iVar6 + (this->name_).super_RepeatedPtrFieldBase.current_size_;
    (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar6;
    pRVar3 = (this->name_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar6) {
      pRVar3->allocated_size = iVar6;
    }
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar4 = (from->identifier_value_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->identifier_value_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->identifier_value_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 & 2) != 0) {
      psVar4 = (from->string_value_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->string_value_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->string_value_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 & 4) != 0) {
      psVar4 = (from->aggregate_value_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 4;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->aggregate_value_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->aggregate_value_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 & 8) != 0) {
      this->positive_int_value_ = from->positive_int_value_;
    }
    if ((uVar1 & 0x10) != 0) {
      this->negative_int_value_ = from->negative_int_value_;
    }
    if ((uVar1 & 0x20) != 0) {
      this->double_value_ = from->double_value_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void UninterpretedOption::MergeFrom(const UninterpretedOption& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.UninterpretedOption)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  name_.MergeFrom(from.name_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_identifier_value(from._internal_identifier_value());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_string_value(from._internal_string_value());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_aggregate_value(from._internal_aggregate_value());
    }
    if (cached_has_bits & 0x00000008u) {
      positive_int_value_ = from.positive_int_value_;
    }
    if (cached_has_bits & 0x00000010u) {
      negative_int_value_ = from.negative_int_value_;
    }
    if (cached_has_bits & 0x00000020u) {
      double_value_ = from.double_value_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}